

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_memory.c
# Opt level: O2

int hash_memory(int hash,uchar *in,unsigned_long inlen,uchar *out,unsigned_long *outlen)

{
  int iVar1;
  hash_state *p;
  
  if (in == (uchar *)0x0) {
    crypt_argchk("in != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x20);
  }
  if (out == (uchar *)0x0) {
    crypt_argchk("out != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x21);
  }
  if (outlen == (unsigned_long *)0x0) {
    crypt_argchk("outlen != NULL",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qartar[P]CascLibPlus/lib/CascLib/src/libtomcrypt/src/hashes/hash_memory.c"
                 ,0x22);
  }
  iVar1 = hash_is_valid(hash);
  if (iVar1 == 0) {
    if (*outlen < hash_descriptor[hash].hashsize) {
      *outlen = hash_descriptor[hash].hashsize;
      iVar1 = 6;
    }
    else {
      p = (hash_state *)LibTomMalloc(0x60);
      if (p == (hash_state *)0x0) {
        iVar1 = 0xd;
      }
      else {
        iVar1 = (*hash_descriptor[hash].init)(p);
        if ((iVar1 == 0) && (iVar1 = (*hash_descriptor[hash].process)(p,in,inlen), iVar1 == 0)) {
          iVar1 = (*hash_descriptor[hash].done)(p,out);
          *outlen = hash_descriptor[hash].hashsize;
        }
        LibTomFree(p);
      }
    }
  }
  return iVar1;
}

Assistant:

int hash_memory(int hash, const unsigned char *in, unsigned long inlen, unsigned char *out, unsigned long *outlen)
{
    hash_state *md;
    int err;

    LTC_ARGCHK(in     != NULL);
    LTC_ARGCHK(out    != NULL);
    LTC_ARGCHK(outlen != NULL);

    if ((err = hash_is_valid(hash)) != CRYPT_OK) {
        return err;
    }

    if (*outlen < hash_descriptor[hash].hashsize) {
       *outlen = hash_descriptor[hash].hashsize;
       return CRYPT_BUFFER_OVERFLOW;
    }

    md = XMALLOC(sizeof(hash_state));
    if (md == NULL) {
       return CRYPT_MEM;
    }

    if ((err = hash_descriptor[hash].init(md)) != CRYPT_OK) {
       goto LBL_ERR;
    }
    if ((err = hash_descriptor[hash].process(md, in, inlen)) != CRYPT_OK) {
       goto LBL_ERR;
    }
    err = hash_descriptor[hash].done(md, out);
    *outlen = hash_descriptor[hash].hashsize;
LBL_ERR:
#ifdef LTC_CLEAN_STACK
    zeromem(md, sizeof(hash_state));
#endif
    XFREE(md);

    return err;
}